

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt,xmlChar *str,int normalize)

{
  xmlChar *pxVar1;
  int inSpace;
  xmlSBuf buf;
  
  buf.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    buf.max = 10000000;
  }
  inSpace = 1;
  buf.mem = (xmlChar *)0x0;
  buf.size = 0;
  buf.cap = 0;
  buf.code = XML_ERR_OK;
  xmlExpandEntityInAttValue(ctxt,&buf,str,(xmlEntityPtr)0x0,normalize,&inSpace,ctxt->inputNr,0);
  if (buf.size != 0 && (inSpace != 0 && normalize != 0)) {
    buf.size = buf.size - 1;
  }
  pxVar1 = xmlSBufFinish(&buf,(int *)0x0,ctxt,"AttValue length too long");
  return pxVar1;
}

Assistant:

xmlChar *
xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt, const xmlChar *str,
                            int normalize) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    int inSpace = 1;

    xmlSBufInit(&buf, maxLength);

    xmlExpandEntityInAttValue(ctxt, &buf, str, NULL, normalize, &inSpace,
                              ctxt->inputNr, /* check */ 0);

    if ((normalize) && (inSpace) && (buf.size > 0))
        buf.size--;

    return(xmlSBufFinish(&buf, NULL, ctxt, "AttValue length too long"));
}